

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O3

void crnlib::MatchFinder_Init(CMatchFinder *p)

{
  uint uVar1;
  CLzRef *pCVar2;
  UInt32 lenLimit;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (p->hashSizeSum != 0) {
    pCVar2 = p->hash;
    uVar4 = 0;
    do {
      pCVar2[uVar4] = 0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < p->hashSizeSum);
  }
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->streamPos = p->cyclicBufferSize;
  p->pos = p->cyclicBufferSize;
  p->result = 0;
  p->streamEndWasReached = 0;
  MatchFinder_ReadBlock(p);
  uVar1 = p->pos;
  uVar6 = p->cyclicBufferSize - p->cyclicBufferPos;
  if (~uVar1 <= uVar6) {
    uVar6 = ~uVar1;
  }
  uVar3 = p->streamPos - uVar1;
  uVar7 = uVar3 - p->keepSizeAfter;
  uVar5 = (uint)(uVar3 != 0);
  if (p->keepSizeAfter <= uVar3 && uVar7 != 0) {
    uVar5 = uVar7;
  }
  if (uVar6 <= uVar5) {
    uVar5 = uVar6;
  }
  if (p->matchMaxLen <= uVar3) {
    uVar3 = p->matchMaxLen;
  }
  p->lenLimit = uVar3;
  p->posLimit = uVar5 + uVar1;
  return;
}

Assistant:

void MatchFinder_Init(CMatchFinder* p) {
  UInt32 i;
  for (i = 0; i < p->hashSizeSum; i++)
    p->hash[i] = kEmptyHashValue;
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->pos = p->streamPos = p->cyclicBufferSize;
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
  MatchFinder_ReadBlock(p);
  MatchFinder_SetLimits(p);
}